

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

bool llb_buildsystem_command_interface_spawn
               (llb_task_interface_t ti,llb_buildsystem_queue_job_context_t *job_context,char **args
               ,int32_t arg_count,char **env_keys,char **env_values,int32_t env_count,
               llb_data_t *working_dir,llb_buildsystem_spawn_delegate_t *delegate)

{
  char *__s;
  char *__s_00;
  ProcessAttributes attributes;
  ProcessStatus PVar1;
  size_t sVar2;
  ProcessDelegate *delegate_00;
  ulong uVar3;
  ArrayRef<llvm::StringRef> commandLine;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment;
  future<llbuild::basic::ProcessResult> result;
  promise<llbuild::basic::ProcessResult> p;
  pair<llvm::StringRef,_llvm::StringRef> *local_118;
  iterator iStack_110;
  pair<llvm::StringRef,_llvm::StringRef> *local_108;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_f8;
  ProcessResult local_e0;
  llb_buildsystem_queue_job_context_t *local_b8;
  undefined2 local_b0;
  undefined6 uStack_ae;
  uint8_t *puStack_a8;
  uint64_t local_a0;
  undefined2 uStack_98;
  undefined6 uStack_96;
  TaskInterface local_90;
  __basic_future<llbuild::basic::ProcessResult> local_80;
  undefined1 local_70 [24];
  code *local_58;
  bool local_50;
  promise<llbuild::basic::ProcessResult> local_48;
  
  local_90.ctx = ti.ctx;
  local_90.impl = ti.impl;
  local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (StringRef *)0x0;
  local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (StringRef *)0x0;
  local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (StringRef *)0x0;
  local_b8 = job_context;
  if (0 < arg_count) {
    uVar3 = 0;
    do {
      local_e0._0_8_ = args[uVar3];
      if ((char *)local_e0._0_8_ == (char *)0x0) {
        local_e0._8_8_ = 0;
      }
      else {
        local_e0._8_8_ = strlen((char *)local_e0._0_8_);
      }
      if (local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>
                  (&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(StringRef *)&local_e0);
      }
      else {
        (local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
         super__Vector_impl_data._M_finish)->Data = (char *)local_e0._0_8_;
        (local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
         super__Vector_impl_data._M_finish)->Length = local_e0._8_8_;
        local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)arg_count != uVar3);
  }
  local_118 = (pair<llvm::StringRef,_llvm::StringRef> *)0x0;
  iStack_110._M_current = (pair<llvm::StringRef,_llvm::StringRef> *)0x0;
  local_108 = (pair<llvm::StringRef,_llvm::StringRef> *)0x0;
  if (0 < env_count) {
    uVar3 = 0;
    do {
      __s = env_keys[uVar3];
      if (__s == (char *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = strlen(__s);
      }
      __s_00 = env_values[uVar3];
      if (__s_00 == (char *)0x0) {
        local_e0.stime = 0;
      }
      else {
        local_e0.stime = strlen(__s_00);
      }
      local_e0._0_8_ = __s;
      local_e0._8_8_ = sVar2;
      local_e0.utime = (uint64_t)__s_00;
      if (iStack_110._M_current == local_108) {
        std::
        vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
        ::_M_realloc_insert<std::pair<llvm::StringRef,llvm::StringRef>>
                  ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                    *)&local_118,iStack_110,(pair<llvm::StringRef,_llvm::StringRef> *)&local_e0);
      }
      else {
        ((iStack_110._M_current)->second).Data = __s_00;
        ((iStack_110._M_current)->second).Length = local_e0.stime;
        ((iStack_110._M_current)->first).Data = __s;
        ((iStack_110._M_current)->first).Length = sVar2;
        iStack_110._M_current = iStack_110._M_current + 1;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)env_count != uVar3);
  }
  std::promise<llbuild::basic::ProcessResult>::promise(&local_48);
  std::__basic_future<llbuild::basic::ProcessResult>::__basic_future(&local_80,&local_48._M_future);
  delegate_00 = (ProcessDelegate *)operator_new(0x10);
  delegate_00->_vptr_ProcessDelegate = (_func_int **)&PTR__ProcessDelegate_0023b2c0;
  delegate_00[1]._vptr_ProcessDelegate = (_func_int **)delegate;
  commandLine.Length =
       (long)local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_start >> 4;
  environment.Length = (long)iStack_110._M_current - (long)local_118 >> 5;
  local_b0 = 1;
  local_a0 = working_dir->length;
  puStack_a8 = working_dir->data;
  uStack_98 = 0x101;
  local_50 = true;
  local_58 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1400:30)>
             ::_M_invoke;
  local_70[8] = '\0';
  local_70[9] = '\0';
  local_70[10] = '\0';
  local_70[0xb] = '\0';
  local_70[0xc] = '\0';
  local_70[0xd] = '\0';
  local_70[0xe] = '\0';
  local_70[0xf] = '\0';
  local_70._16_8_ =
       std::
       _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1400:30)>
       ::_M_manager;
  attributes._2_6_ = uStack_ae;
  attributes.canSafelyInterrupt = true;
  attributes.connectToConsole = false;
  attributes._26_6_ = uStack_96;
  attributes.inheritEnvironment = true;
  attributes.controlEnabled = true;
  attributes.workingDir.Data = (char *)puStack_a8;
  attributes.workingDir.Length = local_a0;
  commandLine.Data =
       local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
       super__Vector_impl_data._M_start;
  environment.Data = local_118;
  local_70._0_8_ = &local_48;
  llbuild::core::TaskInterface::spawn
            (&local_90,(QueueJobContext *)local_b8,commandLine,environment,attributes,
             (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)local_70,delegate_00)
  ;
  if (local_50 == true) {
    if ((code *)local_70._16_8_ != (code *)0x0) {
      (*(code *)local_70._16_8_)(local_70,local_70,3);
    }
    local_50 = false;
  }
  (*delegate_00->_vptr_ProcessDelegate[1])(delegate_00);
  std::future<llbuild::basic::ProcessResult>::get
            (&local_e0,(future<llbuild::basic::ProcessResult> *)&local_80);
  PVar1 = local_e0.status;
  if (local_80._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<llbuild::basic::ProcessResult>::~promise(&local_48);
  if (local_118 != (pair<llvm::StringRef,_llvm::StringRef> *)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  if (local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start != (StringRef *)0x0) {
    operator_delete(local_f8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return PVar1 == Succeeded;
}

Assistant:

bool llb_buildsystem_command_interface_spawn(llb_task_interface_t ti, llb_buildsystem_queue_job_context_t *job_context, const char * const*args, int32_t arg_count, const char * const *env_keys, const char * const *env_values, int32_t env_count, llb_data_t *working_dir, llb_buildsystem_spawn_delegate_t *delegate) {
  auto coreti = reinterpret_cast<core::TaskInterface*>(&ti);
  auto arguments = std::vector<StringRef>();
  for (int32_t i = 0; i < arg_count; i++) {
    arguments.push_back(StringRef(args[i]));
  }
  auto environment = std::vector<std::pair<StringRef, StringRef>>();
  for (int32_t i = 0; i < env_count; i++) {
    environment.push_back(std::pair<StringRef, StringRef>(StringRef(env_keys[i]), StringRef(env_values[i])));
  }
  
  std::promise<ProcessResult> p;
  auto result = p.get_future();
  auto commandCompletionFn = [&p](ProcessResult processResult) mutable {
    p.set_value(processResult);
  };
  
  class ForwardingProcessDelegate: public basic::ProcessDelegate {
    llb_buildsystem_spawn_delegate_t *delegate;
    
  public:
    ForwardingProcessDelegate(llb_buildsystem_spawn_delegate_t *delegate): delegate(delegate) {}
    
    virtual void processStarted(ProcessContext* ctx, ProcessHandle handle,
                                llbuild_pid_t pid) {
      if (delegate != NULL) {
        delegate->process_started(delegate->context, pid);
      }
    }

    virtual void processHadError(ProcessContext* ctx, ProcessHandle handle,
                                 const Twine& message) {
      if (delegate != NULL) {
        auto errStr = message.str();
        llb_data_t err{ errStr.size(), (const uint8_t*) errStr.data() };
        delegate->process_had_error(delegate->context, &err);
      }
    };

    virtual void processHadOutput(ProcessContext* ctx, ProcessHandle handle,
                                  StringRef data) {
      if (delegate != NULL) {
        llb_data_t message{ data.size(), (const uint8_t*) data.data() };
        delegate->process_had_output(delegate->context, &message);
      }
    };

    virtual void processFinished(ProcessContext* ctx, ProcessHandle handle,
                                 const ProcessResult& result) {
      if (delegate != NULL) {
        llb_buildsystem_command_extended_result_t res;
        res.result = get_command_result(result.status);
        res.exit_status = result.exitCode;
        res.pid = result.pid;
        res.utime = result.utime;
        res.stime = result.stime;
        res.maxrss = result.maxrss;
        delegate->process_finished(delegate->context, &res);
      }
    }

  };

  auto forwardingDelegate = new ForwardingProcessDelegate(delegate);
  coreti->spawn((QueueJobContext*)job_context, ArrayRef<StringRef>(arguments), ArrayRef<std::pair<StringRef, StringRef>>(environment), {true, false, StringRef((const char*)working_dir->data, working_dir->length)}, {commandCompletionFn}, forwardingDelegate);

  delete forwardingDelegate;

  return result.get().status == ProcessStatus::Succeeded;  
}